

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
clipp::usage_lines::group_surrounders_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,usage_lines *this,group *group,context *cur)

{
  group *pgVar1;
  bool bVar2;
  child_t<clipp::parameter,_clipp::group> *this_00;
  string prefix;
  string postfix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
  pgVar1 = cur->outermost;
  if ((pgVar1 == group) && (this->ommitOutermostSurrounders_ == true)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    goto LAB_001104e8;
  }
  if (group->exclusive_ == true) {
    bVar2 = clipp::group::all_optional(group);
    if (!bVar2) {
      bVar2 = clipp::group::all_flagless(group);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&local_b0);
      }
      else {
        bVar2 = context::is_singleton(cur);
        if (pgVar1 == group && bVar2) goto LAB_00110459;
        std::__cxx11::string::_M_assign((string *)&local_b0);
      }
      goto LAB_00110449;
    }
    std::__cxx11::string::_M_assign((string *)&local_b0);
    std::__cxx11::string::_M_assign((string *)&local_90);
    bVar2 = clipp::group::all_flagless(group);
    if (bVar2) {
      std::__cxx11::string::append((string *)&local_b0);
      std::operator+(&local_70,&(this->fmt_).labelPre_,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    this_00 = (group->children_).
              super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(group->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)this_00) / 0x108)) {
      bVar2 = clipp::group::child_t<clipp::parameter,_clipp::group>::blocking(this_00);
      this_00 = (group->children_).
                super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar2) {
        bVar2 = clipp::group::child_t<clipp::parameter,_clipp::group>::required(this_00);
        if (!bVar2) {
          std::__cxx11::string::_M_assign((string *)&local_b0);
          goto LAB_00110449;
        }
        this_00 = (group->children_).
                  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    if ((((ulong)(((long)(group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)this_00) / 0x108) < 2)
        || (((cur->pos).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].parent)->exclusive_ != true)) ||
       (cur->outermost == group)) {
      if (((group->exclusive_ != false) || (group->joinable_ != true)) || (cur->linestart != false))
      goto LAB_00110459;
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
LAB_00110449:
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
LAB_00110459:
  if ((group->super_token<clipp::group>).repeatable_ == true) {
    if (local_b0._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    std::operator+(&local_70,&(this->fmt_).repeatPre_,&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_90._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    std::__cxx11::string::append((string *)&local_90);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_b0,&local_90);
LAB_001104e8:
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string,string>
    group_surrounders(const group& group, const context& cur) const
    {
        string prefix;
        string postfix;

        const bool isOutermost = &group == cur.outermost;
        if(isOutermost && ommitOutermostSurrounders_)
            return {string{}, string{}};

        if(group.exclusive()) {
            if(group.all_optional()) {
                prefix  = fmt_.optional_prefix();
                postfix = fmt_.optional_postfix();
                if(group.all_flagless()) {
                    prefix  += fmt_.label_prefix();
                    postfix = fmt_.label_prefix() + postfix;
                }
            } else if(group.all_flagless()) {
                prefix  = fmt_.label_prefix();
                postfix = fmt_.label_postfix();
            } else if(!cur.is_singleton() || !isOutermost) {
                prefix  = fmt_.alternatives_prefix();
                postfix = fmt_.alternatives_postfix();
            }
        }
        else if(group.size() > 1 &&
                group.front().blocking() && !group.front().required())
        {
            prefix  = fmt_.optional_prefix();
            postfix = fmt_.optional_postfix();
        }
        else if(group.size() > 1 && cur.is_alternative() &&
                &group != cur.outermost)
        {
            prefix  = fmt_.group_prefix();
            postfix = fmt_.group_postfix();
        }
        else if(!group.exclusive() &&
            group.joinable() && !cur.linestart)
        {
            prefix  = fmt_.joinable_prefix();
            postfix = fmt_.joinable_postfix();
        }

        if(group.repeatable()) {
            if(prefix.empty()) prefix = fmt_.group_prefix();
            prefix = fmt_.repeat_prefix() + prefix;
            if(postfix.empty()) postfix = fmt_.group_postfix();
            postfix += fmt_.repeat_postfix();
        }

        return {std::move(prefix), std::move(postfix)};
    }